

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O1

bool __thiscall
OpenMesh::PolyConnectivity::is_simply_connected(PolyConnectivity *this,FaceHandle _fh)

{
  size_t *this_00;
  value_type vVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  bool bVar4;
  undefined1 local_80 [8];
  set<OpenMesh::FaceHandle,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
  nb_fhs;
  ConstFaceFaceIter cff_it;
  
  nb_fhs._M_t._M_impl._0_4_ = 0;
  nb_fhs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  nb_fhs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  nb_fhs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  nb_fhs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&nb_fhs;
  nb_fhs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&nb_fhs;
  Iterators::
  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
  ::GenericCirculatorT
            ((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
              *)&nb_fhs._M_t._M_impl.super__Rb_tree_header._M_node_count,this,
             (FaceHandle)_fh.super_BaseHandle.idx_,false);
  this_00 = &nb_fhs._M_t._M_impl.super__Rb_tree_header._M_node_count;
  while( true ) {
    if (cff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ == -1) {
      bVar4 = false;
    }
    else {
      bVar4 = true;
      if ((int)cff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ ==
          cff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_) {
        bVar4 = cff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.
                super_BaseHandle.idx_ == 0;
      }
    }
    if (bVar4 == false) break;
    vVar1 = Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
            ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                         *)this_00);
    p_Var2 = (_Base_ptr)&nb_fhs;
    for (p_Var3 = (_Base_ptr)nb_fhs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
        p_Var3 != (_Base_ptr)0x0;
        p_Var3 = (&p_Var3->_M_left)[*(int *)(p_Var3 + 1) < (int)vVar1.super_BaseHandle.idx_]) {
      if ((int)vVar1.super_BaseHandle.idx_ <= *(int *)(p_Var3 + 1)) {
        p_Var2 = p_Var3;
      }
    }
    p_Var3 = (_Base_ptr)&nb_fhs;
    if ((p_Var2 != (_Base_ptr)&nb_fhs) &&
       (p_Var3 = p_Var2, (int)vVar1.super_BaseHandle.idx_ < (int)p_Var2[1]._M_color)) {
      p_Var3 = (_Base_ptr)&nb_fhs;
    }
    if (p_Var3 != (_Base_ptr)&nb_fhs) break;
    cff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ =
         Iterators::
         GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
         ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                      *)this_00);
    std::
    _Rb_tree<OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_std::_Identity<OpenMesh::FaceHandle>,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
    ::_M_insert_unique<OpenMesh::FaceHandle>
              ((_Rb_tree<OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_std::_Identity<OpenMesh::FaceHandle>,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
                *)local_80,
               (FaceHandle *)
               &cff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.field_0x14);
    Iterators::
    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
    ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                  *)this_00);
  }
  std::
  _Rb_tree<OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_std::_Identity<OpenMesh::FaceHandle>,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
  ::~_Rb_tree((_Rb_tree<OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_std::_Identity<OpenMesh::FaceHandle>,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
               *)local_80);
  return (bool)(bVar4 ^ 1);
}

Assistant:

bool PolyConnectivity::is_simply_connected(FaceHandle _fh) const
{
  std::set<FaceHandle> nb_fhs;
  for (ConstFaceFaceIter cff_it = cff_iter(_fh); cff_it.is_valid(); ++cff_it)
  {
    if (nb_fhs.find(*cff_it) == nb_fhs.end())
    {
      nb_fhs.insert(*cff_it);
    }
    else
    {//there is more than one link
      return false;
    }
  }
  return true;
}